

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O1

UDataMemory * udata_findCachedData(char *path,UErrorCode *err)

{
  UHashtable *hash;
  char *pcVar1;
  void *pvVar2;
  UDataMemory *pUVar3;
  char *key;
  
  hash = udata_getHashTable(err);
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar1 = strrchr(path,0x2f);
    key = pcVar1 + 1;
    if (pcVar1 == (char *)0x0) {
      key = path;
    }
    pUVar3 = (UDataMemory *)0x0;
    umtx_lock_63((UMutex *)0x0);
    pvVar2 = uhash_get_63(hash,key);
    umtx_unlock_63((UMutex *)0x0);
    if (pvVar2 != (void *)0x0) {
      pUVar3 = *(UDataMemory **)((long)pvVar2 + 8);
    }
  }
  else {
    pUVar3 = (UDataMemory *)0x0;
  }
  return pUVar3;
}

Assistant:

static UDataMemory *udata_findCachedData(const char *path, UErrorCode &err)
{
    UHashtable        *htable;
    UDataMemory       *retVal = NULL;
    DataCacheElement  *el;
    const char        *baseName;

    htable = udata_getHashTable(err);
    if (U_FAILURE(err)) {
        return NULL;
    }

    baseName = findBasename(path);   /* Cache remembers only the base name, not the full path. */
    umtx_lock(NULL);
    el = (DataCacheElement *)uhash_get(htable, baseName);
    umtx_unlock(NULL);
    if (el != NULL) {
        retVal = el->item;
    }
#ifdef UDATA_DEBUG
    fprintf(stderr, "Cache: [%s] -> %p\n", baseName, retVal);
#endif
    return retVal;
}